

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.cpp
# Opt level: O2

void __thiscall
dynamicgraph::Tracer::addSignalToTraceByName(Tracer *this,string *signame,string *filename)

{
  istringstream *piVar1;
  SignalBase<int> *sig;
  istringstream iss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)signame,_S_in);
  piVar1 = (istringstream *)dynamicgraph::PoolStorage::getInstance();
  sig = (SignalBase<int> *)dynamicgraph::PoolStorage::getSignal(piVar1);
  addSignalToTrace(this,sig,filename);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return;
}

Assistant:

void Tracer::addSignalToTraceByName(const string &signame,
                                    const string &filename) {
  dgDEBUGIN(15);
  istringstream iss(signame);
  SignalBase<int> &sig = PoolStorage::getInstance()->getSignal(iss);
  addSignalToTrace(sig, filename);
  dgDEBUGOUT(15);
}